

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

JsonObjectWriter * __thiscall
Catch::JsonArrayWriter::writeObject(JsonObjectWriter *__return_storage_ptr__,JsonArrayWriter *this)

{
  JsonUtils::appendCommaNewline(this->m_os,&this->m_should_comma,this->m_indent_level + 1);
  JsonObjectWriter::JsonObjectWriter(__return_storage_ptr__,this->m_os,this->m_indent_level + 1);
  return __return_storage_ptr__;
}

Assistant:

JsonObjectWriter JsonArrayWriter::writeObject() {
        JsonUtils::appendCommaNewline(
            m_os, m_should_comma, m_indent_level + 1 );
        return JsonObjectWriter{ m_os, m_indent_level + 1 };
    }